

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

int __thiscall
QWidgetLineControl::copy(QWidgetLineControl *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QString *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  selectedText((QString *)&local_38,this);
  if (((undefined1 *)local_38.size != (undefined1 *)0x0) && (((byte)this[0x50] & 0x30) == 0)) {
    pQVar1 = (QString *)QGuiApplication::clipboard();
    QClipboard::setText(pQVar1,(Mode)&local_38);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::copy(QClipboard::Mode mode) const
{
    QString t = selectedText();
    if (!t.isEmpty() && m_echoMode == QLineEdit::Normal) {
        QGuiApplication::clipboard()->setText(t, mode);
    }
}